

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O3

void __thiscall StringType::~StringType(StringType *this)

{
  ~StringType(this);
  operator_delete(this,0x1b0);
  return;
}

Assistant:

StringType::~StringType()
	{
	// TODO: Unref for Objects
	// Question: why Unref?
	//
	// Unref(str_);
	// Unref(regex_);

	delete string_length_var_field_;
	delete elem_datatype_;
	}